

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double units::getDoubleFromString(string *ustring,size_t *index)

{
  char *pcVar1;
  char *pcVar2;
  long *in_RSI;
  longdouble in_ST0;
  longdouble in_ST1;
  double dVar3;
  longdouble vld;
  char *retloc;
  char *local_20;
  long *local_18;
  double local_8;
  
  local_20 = (char *)0x0;
  local_18 = in_RSI;
  pcVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6e06bd);
  strtold(pcVar1,&local_20);
  pcVar1 = local_20;
  if (local_20 == (char *)0x0) {
    *local_18 = 0;
    local_8 = NAN;
  }
  else {
    pcVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6e0712);
    *local_18 = (long)pcVar1 - (long)pcVar2;
    if (*local_18 == 0) {
      local_8 = NAN;
    }
    else {
      dVar3 = CLI::std::numeric_limits<double>::max();
      if (in_ST0 <= (longdouble)dVar3) {
        dVar3 = CLI::std::numeric_limits<double>::max();
        if ((longdouble)-dVar3 <= in_ST0) {
          std::fabs(-dVar3);
          dVar3 = CLI::std::numeric_limits<double>::min();
          if ((longdouble)dVar3 <= in_ST1) {
            local_8 = (double)in_ST0;
          }
          else {
            local_8 = 0.0;
          }
        }
        else {
          local_8 = -INFINITY;
        }
      }
      else {
        local_8 = INFINITY;
      }
    }
  }
  return local_8;
}

Assistant:

static double
    getDoubleFromString(const std::string& ustring, size_t* index) noexcept
{
    char* retloc = nullptr;
    auto vld = strtold(ustring.c_str(), &retloc);
    // LCOV_EXCL_START
    if (retloc == nullptr) {
        // to the best of my knowledge this should not happen but this is a
        // weird function sometimes with a lot of platform variations
        *index = 0;
        return constants::invalid_conversion;
    }
    // LCOV_EXCL_STOP
    *index = (retloc - ustring.c_str());
    // so if it converted anything then we can probably use that value if not
    // return NaN
    if (*index == 0) {
        return constants::invalid_conversion;
    }

    if (vld > static_cast<long double>(std::numeric_limits<double>::max())) {
        return constants::infinity;
    }
    if (vld < static_cast<long double>(-std::numeric_limits<double>::max())) {
        return -constants::infinity;
    }
    // floating point min gives you the smallest representable positive value
    if (std::fabs(vld) <
        static_cast<long double>(std::numeric_limits<double>::min())) {
        return 0.0;
    }
    return static_cast<double>(vld);
}